

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdCelsiusStencilVal::emulate_mthd(MthdCelsiusStencilVal *this)

{
  pgraph_state *state;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint err;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4;
  uVar3 = (this->super_SingleMthdTest).super_MthdTest.val;
  err = uVar2 + 2;
  if (uVar3 < 0x100) {
    err = uVar2;
  }
  if (this->which != 0) {
    err = uVar2;
  }
  if (err != 0) {
    MthdTest::warn((MthdTest *)this,err);
    return;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    bVar1 = (char)(this->which << 3) + 8;
    uVar3 = (uVar3 & 0xff) << (bVar1 & 0x3f) |
            ~(uint)(0xffL << (bVar1 & 0x3f)) &
            (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_stencil_a = uVar3;
    pgraph_celsius_icmd(state,0x1d,uVar3,true);
    return;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (which == 0 && val & ~0xff)
			err |= 2;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_stencil_a, 8 + 8 * which, 8, val);
				pgraph_celsius_icmd(&exp, 0x1d, exp.bundle_stencil_a, true);
			}
		}
	}